

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::EnableBlendCase::iterate(EnableBlendCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLenum err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  int local_21c;
  GLuint local_218;
  int ndx_5;
  int ndx_4;
  allocator<char> local_1e9;
  string local_1e8;
  ScopedLogSection local_1c8;
  ScopedLogSection superSection_2;
  GLuint local_1b8;
  int ndx_3;
  int ndx_2;
  allocator<char> local_189;
  string local_188;
  ScopedLogSection local_168;
  ScopedLogSection superSection_1;
  int ndx_1;
  allocator<char> local_131;
  string local_130;
  ScopedLogSection local_110;
  ScopedLogSection superSection;
  int ndx;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  deInt32 maxDrawBuffers;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  EnableBlendCase *this_local;
  
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar3,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  section.m_log._0_4_ = 0;
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8824,(GLint *)&section);
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x378);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Initial",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Initial value",(allocator<char> *)((long)&superSection.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar3,&local_d8,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&superSection.m_log + 7));
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  for (superSection.m_log._0_4_ = 0; (int)superSection.m_log < (int)section.m_log;
      superSection.m_log._0_4_ = (int)superSection.m_log + 1) {
    gls::StateQueryUtil::verifyStateIndexedBoolean
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0xbe2,(int)superSection.m_log,false,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"AfterSettingCommon",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_1,"After setting common",
             (allocator<char> *)((long)&superSection_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_110,pTVar3,&local_130,(string *)&ndx_1);
  std::__cxx11::string::~string((string *)&ndx_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&superSection_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  glu::CallLogWrapper::glEnable((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xbe2);
  for (superSection_1.m_log._0_4_ = 0; (int)superSection_1.m_log < (int)section.m_log;
      superSection_1.m_log._0_4_ = (int)superSection_1.m_log + 1) {
    gls::StateQueryUtil::verifyStateIndexedBoolean
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0xbe2,(int)superSection_1.m_log,true,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_110);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"AfterSettingIndexed",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_2,"After setting indexed",(allocator<char> *)((long)&ndx_3 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_168,pTVar3,&local_188,(string *)&ndx_2);
  std::__cxx11::string::~string((string *)&ndx_2);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_3 + 3));
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  for (local_1b8 = 0; (int)local_1b8 < (int)section.m_log; local_1b8 = local_1b8 + 1) {
    if ((int)local_1b8 % 2 == 0) {
      glu::CallLogWrapper::glEnablei
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xbe2,local_1b8);
    }
    else {
      glu::CallLogWrapper::glDisablei
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xbe2,local_1b8);
    }
  }
  for (superSection_2.m_log._4_4_ = 0; (int)superSection_2.m_log._4_4_ < (int)section.m_log;
      superSection_2.m_log._4_4_ = superSection_2.m_log._4_4_ + 1) {
    gls::StateQueryUtil::verifyStateIndexedBoolean
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0xbe2,superSection_2.m_log._4_4_,
               superSection_2.m_log._4_4_ ==
               (superSection_2.m_log._4_4_ - ((int)superSection_2.m_log._4_4_ >> 0x1f) & 0xfffffffe)
               ,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_168);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"AfterResettingIndexedWithCommon",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_4,"After resetting indexed with common",
             (allocator<char> *)((long)&ndx_5 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_1c8,pTVar3,&local_1e8,(string *)&ndx_4);
  std::__cxx11::string::~string((string *)&ndx_4);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_5 + 3));
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  for (local_218 = 0; (int)local_218 < (int)section.m_log; local_218 = local_218 + 1) {
    if ((int)local_218 % 2 == 0) {
      glu::CallLogWrapper::glEnablei
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xbe2,local_218);
    }
    else {
      glu::CallLogWrapper::glDisablei
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xbe2,local_218);
    }
  }
  glu::CallLogWrapper::glEnable((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xbe2);
  for (local_21c = 0; local_21c < (int)section.m_log; local_21c = local_21c + 1) {
    gls::StateQueryUtil::verifyStateIndexedBoolean
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0xbe2,local_21c,true,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1c8);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

EnableBlendCase::IterateResult EnableBlendCase::iterate (void)
{
	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_BLEND, ndx, false, m_verifierType);
	}
	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glEnable(GL_BLEND);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_BLEND, ndx, true, m_verifierType);

	}
	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
		{
			if (ndx % 2 == 0)
				gl.glEnablei(GL_BLEND, ndx);
			else
				gl.glDisablei(GL_BLEND, ndx);
		}

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_BLEND, ndx, (ndx % 2 == 0), m_verifierType);
	}
	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
		{
			if (ndx % 2 == 0)
				gl.glEnablei(GL_BLEND, ndx);
			else
				gl.glDisablei(GL_BLEND, ndx);
		}

		gl.glEnable(GL_BLEND);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_BLEND, ndx, true, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}